

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall
basisu::vector<basisu::basisu_frontend::endpoint_cluster_etc_params>::clear
          (vector<basisu::basisu_frontend::endpoint_cluster_etc_params> *this)

{
  endpoint_cluster_etc_params *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  if (*(long *)in_RDI->m_color_unscaled != 0) {
    scalar_type<basisu::basisu_frontend::endpoint_cluster_etc_params>::destruct_array
              (in_RDI,in_stack_ffffffffffffffe8);
    free(*(void **)in_RDI->m_color_unscaled);
    in_RDI->m_color_unscaled[0] = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
    in_RDI->m_color_unscaled[1] = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
    in_RDI->m_inten_table[0] = 0;
    in_RDI->m_inten_table[1] = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            free(m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }